

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

btDbvtVolume * VolumeOf(Face *f,btScalar margin)

{
  btDbvtAabbMm *in_RDI;
  btVector3 *pts [3];
  btDbvtAabbMm *this;
  btScalar in_stack_ffffffffffffffcc;
  btVector3 **in_stack_ffffffffffffffd0;
  btScalar local_c [3];
  
  this = in_RDI;
  btDbvtAabbMm::FromPoints(in_stack_ffffffffffffffd0,(int)in_stack_ffffffffffffffcc);
  btVector3::btVector3((btVector3 *)&stack0xffffffffffffffc8,local_c,local_c,local_c);
  btDbvtAabbMm::Expand(this,&in_RDI->mi);
  return this;
}

Assistant:

static inline btDbvtVolume	VolumeOf(	const btSoftBody::Face& f,
									 btScalar margin)
{
	const btVector3*	pts[]={	&f.m_n[0]->m_x,
		&f.m_n[1]->m_x,
		&f.m_n[2]->m_x};
	btDbvtVolume		vol=btDbvtVolume::FromPoints(pts,3);
	vol.Expand(btVector3(margin,margin,margin));
	return(vol);
}